

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

int __thiscall dh::analysis::numberInteger(analysis *this)

{
  TYPE TVar1;
  int iVar2;
  element_type *peVar3;
  ostream *poVar4;
  token local_1f0;
  int local_1c8 [2];
  int ret;
  undefined1 local_1b8 [40];
  stringstream ss;
  ostream local_188 [376];
  analysis *local_10;
  analysis *this_local;
  
  local_10 = this;
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->tmp);
  TVar1 = token::getType(peVar3);
  if (TVar1 == NUMINT) {
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 0x20));
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &this->tmp);
    token::getVal_abi_cxx11_((token *)local_1b8);
    std::operator<<(local_188,(string *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::istream::operator>>((istream *)(local_1b8 + 0x20),local_1c8);
    scanner::getToken(&local_1f0,&this->_tokens);
    peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->tmp);
    token::operator=(peVar3,&local_1f0);
    token::~token(&local_1f0);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 0x20));
    return local_1c8[0];
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[ERROR] Incompitable type: \"");
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->tmp);
  TVar1 = token::getType(peVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,TVar1);
  poVar4 = std::operator<<(poVar4,"\" in line ");
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->tmp);
  iVar2 = token::getLineno(peVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4," expect int type\n");
  exit(1);
}

Assistant:

int analysis::numberInteger()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in numberInteger\n";
#endif

	if ( tmp->getType() == TYPE::NUMINT)
	{
		::std::stringstream ss;
		ss << tmp->getVal();

		int ret;
		ss >> ret;
		*tmp = _tokens.getToken();

		return ret;
	} else 
	{
		::std::cerr << "[ERROR] Incompitable type: \""
			<< tmp->getType()
			<< "\" in line "
			<< tmp->getLineno()
			<< " expect int type\n";
		::std::exit(1);
	}
}